

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O3

void __thiscall LinuxEvents<0>::report_error(LinuxEvents<0> *this,string *context)

{
  long *plVar1;
  pointer pcVar2;
  int *piVar3;
  char *__s;
  undefined8 *puVar4;
  ostream *poVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  allocator<char> local_79;
  long *local_78;
  long local_70;
  long local_68;
  undefined8 uStack_60;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  if (this->working != true) goto LAB_00105173;
  pcVar2 = (context->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + context->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_79);
  uVar6 = 0xf;
  if (local_58 != local_48) {
    uVar6 = local_48[0];
  }
  if (uVar6 < (ulong)(local_30 + local_50)) {
    uVar6 = 0xf;
    if (local_38 != local_28) {
      uVar6 = local_28[0];
    }
    if (uVar6 < (ulong)(local_30 + local_50)) goto LAB_00105083;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_00105083:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_38);
  }
  local_78 = &local_68;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_68 = *plVar1;
    uStack_60 = puVar4[3];
  }
  else {
    local_68 = *plVar1;
    local_78 = (long *)*puVar4;
  }
  local_70 = puVar4[1];
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
LAB_00105173:
  this->working = false;
  return;
}

Assistant:

void report_error(const std::string &context) {
     if(working) std::cerr << (context + ": " + std::string(strerror(errno))) << std::endl;
     working = false;
  }